

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O2

Size __thiscall CMU462::Vertex::degree(Vertex *this)

{
  _List_node_base *p_Var1;
  Size SVar2;
  _List_node_base *p_Var3;
  
  p_Var1 = (this->_halfedge)._M_node;
  SVar2 = 0;
  p_Var3 = p_Var1;
  do {
    SVar2 = SVar2 + ((ulong)*(byte *)&p_Var3[3]._M_prev[0xc]._M_next ^ 1);
    p_Var3 = p_Var3[1]._M_prev[2]._M_next;
  } while (p_Var1 != p_Var3);
  return SVar2;
}

Assistant:

Size degree() const {
          Size d = 0;  // degree

          // iterate over halfedges incident on this vertex
          HalfedgeIter h = _halfedge;
          do {
            // don't count boundary loops
            if (!h->face()->isBoundary()) {
              d++;  // increment degree
            }

            // move to the next halfedge around the vertex
            h = h->twin()->next();
          } while (h != _halfedge);  // done iterating over halfedges

          return d;
        }